

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O2

FT_Error bdf_list_split_(bdf_list_t_ *list,char *separators,char *line,unsigned_long linelen)

{
  bool bVar1;
  FT_Error FVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  byte bVar5;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  byte *pbVar10;
  char *pcVar11;
  char seps [32];
  
  list->used = 0;
  if (list->size != 0) {
    *list->field = "";
    list->field[1] = "";
    list->field[2] = "";
    list->field[3] = "";
    list->field[4] = "";
  }
  if (linelen == 0) {
    return 0;
  }
  bVar5 = *line;
  if (bVar5 == 0) {
    return 0;
  }
  if (separators == (char *)0x0) {
    return 6;
  }
  bVar7 = *separators;
  if (bVar7 == 0) {
    return 6;
  }
  seps[0x10] = '\0';
  seps[0x11] = '\0';
  seps[0x12] = '\0';
  seps[0x13] = '\0';
  seps[0x14] = '\0';
  seps[0x15] = '\0';
  seps[0x16] = '\0';
  seps[0x17] = '\0';
  seps[0x18] = '\0';
  seps[0x19] = '\0';
  seps[0x1a] = '\0';
  seps[0x1b] = '\0';
  seps[0x1c] = '\0';
  seps[0x1d] = '\0';
  seps[0x1e] = '\0';
  seps[0x1f] = '\0';
  seps[0] = '\0';
  seps[1] = '\0';
  seps[2] = '\0';
  seps[3] = '\0';
  seps[4] = '\0';
  seps[5] = '\0';
  seps[6] = '\0';
  seps[7] = '\0';
  seps[8] = '\0';
  seps[9] = '\0';
  seps[10] = '\0';
  seps[0xb] = '\0';
  seps[0xc] = '\0';
  seps[0xd] = '\0';
  seps[0xe] = '\0';
  seps[0xf] = '\0';
  pbVar6 = (byte *)(separators + 1);
  bVar1 = false;
  do {
    if (bVar7 == 0x2b) {
      bVar8 = *pbVar6;
      if (bVar8 != 0) goto LAB_001e2d91;
      bVar7 = 0;
      bVar1 = true;
    }
    else {
      if (bVar7 == 0) break;
      bVar8 = *pbVar6;
LAB_001e2d91:
      seps[bVar7 >> 3] = seps[bVar7 >> 3] | '\x01' << (bVar7 & 7);
      bVar7 = bVar8;
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
  uVar9 = 0;
  pcVar11 = line;
LAB_001e2dbd:
  do {
    if ((line + linelen <= pcVar11) || (pbVar6 = (byte *)pcVar11, bVar5 == 0)) {
      uVar3 = list->used;
      if (list->size <= uVar3 + uVar9) {
        FVar2 = bdf_list_ensure_(list,uVar3 + uVar9 + 1);
        if (FVar2 != 0) {
          return FVar2;
        }
        uVar3 = list->used;
      }
      uVar4 = uVar3;
      if (uVar9 != 0) {
        uVar4 = uVar3 + 1;
        list->used = uVar4;
        list->field[uVar3] = "";
      }
      list->field[uVar4] = (char *)0x0;
      return 0;
    }
    while ((pbVar10 = pbVar6 + 1, bVar5 != 0 && (((byte)seps[bVar5 >> 3] >> (bVar5 & 7) & 1) == 0)))
    {
      bVar5 = *pbVar10;
      pbVar6 = pbVar10;
    }
    uVar3 = list->used;
    if (uVar3 == list->size) {
      FVar2 = bdf_list_ensure_(list,uVar3 + 1);
      if (FVar2 != 0) {
        return FVar2;
      }
      uVar3 = list->used;
    }
    if (pbVar6 <= pcVar11) {
      pcVar11 = "";
    }
    list->used = uVar3 + 1;
    list->field[uVar3] = pcVar11;
    pcVar11 = (char *)pbVar6;
    if (!bVar1) goto LAB_001e2e72;
    while ((bVar5 = *pcVar11, bVar5 != 0 && (((byte)seps[bVar5 >> 3] >> (bVar5 & 7) & 1) != 0))) {
      *pcVar11 = 0;
      pcVar11 = (char *)((byte *)pcVar11 + 1);
    }
    uVar9 = 0;
  } while (pcVar11 <= pbVar6);
  goto LAB_001e2e92;
LAB_001e2e72:
  bVar5 = 0;
  uVar9 = 0;
  if (*pbVar6 != 0) {
    *pbVar6 = 0;
    bVar5 = *pbVar10;
    pcVar11 = (char *)pbVar10;
LAB_001e2e92:
    uVar9 = (ulong)(bVar5 == 0);
  }
  goto LAB_001e2dbd;
}

Assistant:

static FT_Error
  bdf_list_split_( bdf_list_t_*   list,
                   const char*    separators,
                   char*          line,
                   unsigned long  linelen )
  {
    unsigned long  final_empty;
    int            mult;
    const char     *sp, *end;
    char           *ep;
    char           seps[32];
    FT_Error       error = FT_Err_Ok;


    /* Initialize the list. */
    list->used = 0;
    if ( list->size )
    {
      list->field[0] = (char*)empty;
      list->field[1] = (char*)empty;
      list->field[2] = (char*)empty;
      list->field[3] = (char*)empty;
      list->field[4] = (char*)empty;
    }

    /* If the line is empty, then simply return. */
    if ( linelen == 0 || line[0] == 0 )
      goto Exit;

    /* In the original code, if the `separators' parameter is NULL or */
    /* empty, the list is split into individual bytes.  We don't need */
    /* this, so an error is signaled.                                 */
    if ( separators == NULL || *separators == 0 )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Prepare the separator bitmap. */
    FT_MEM_ZERO( seps, 32 );

    /* If the very last character of the separator string is a plus, then */
    /* set the `mult' flag to indicate that multiple separators should be */
    /* collapsed into one.                                                */
    for ( mult = 0, sp = separators; sp && *sp; sp++ )
    {
      if ( *sp == '+' && *( sp + 1 ) == 0 )
        mult = 1;
      else
        setsbit( seps, *sp );
    }

    /* Break the line up into fields. */
    for ( final_empty = 0, sp = ep = line, end = sp + linelen;
          sp < end && *sp; )
    {
      /* Collect everything that is not a separator. */
      for ( ; *ep && !sbitset( seps, *ep ); ep++ )
        ;

      /* Resize the list if necessary. */
      if ( list->used == list->size )
      {
        error = bdf_list_ensure_( list, list->used + 1 );
        if ( error )
          goto Exit;
      }

      /* Assign the field appropriately. */
      list->field[list->used++] = ( ep > sp ) ? (char*)sp : (char*)empty;

      sp = ep;

      if ( mult )
      {
        /* If multiple separators should be collapsed, do it now by */
        /* setting all the separator characters to 0.               */
        for ( ; *ep && sbitset( seps, *ep ); ep++ )
          *ep = 0;
      }
      else if ( *ep != 0 )
        /* Don't collapse multiple separators by making them 0, so just */
        /* make the one encountered 0.                                  */
        *ep++ = 0;

      final_empty = ( ep > sp && *ep == 0 );
      sp = ep;
    }

    /* Finally, NULL-terminate the list. */
    if ( list->used + final_empty >= list->size )
    {
      error = bdf_list_ensure_( list, list->used + final_empty + 1 );
      if ( error )
        goto Exit;
    }

    if ( final_empty )
      list->field[list->used++] = (char*)empty;

    list->field[list->used] = NULL;

  Exit:
    return error;
  }